

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::addSymbolLinkageNode
          (TIntermediate *this,TIntermAggregate **linkage,TSymbol *symbol)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TVariable *variable;
  TIntermSymbol *right;
  TIntermAggregate *pTVar2;
  TSourceLoc local_38;
  
  iVar1 = (*symbol->_vptr_TSymbol[10])(symbol);
  variable = (TVariable *)CONCAT44(extraout_var,iVar1);
  if (variable == (TVariable *)0x0) {
    iVar1 = (*symbol->_vptr_TSymbol[0xb])(symbol);
    variable = (TVariable *)
               (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xb0))
                         ((long *)CONCAT44(extraout_var_00,iVar1));
  }
  local_38.name = (TString *)0x0;
  local_38.string = 0;
  local_38.line = 0;
  local_38.column = 0;
  right = addSymbol(this,variable,&local_38);
  pTVar2 = growAggregate(this,(TIntermNode *)*linkage,(TIntermNode *)right);
  *linkage = pTVar2;
  return;
}

Assistant:

void TIntermediate::addSymbolLinkageNode(TIntermAggregate*& linkage, const TSymbol& symbol)
{
    const TVariable* variable = symbol.getAsVariable();
    if (! variable) {
        // This must be a member of an anonymous block, and we need to add the whole block
        const TAnonMember* anon = symbol.getAsAnonMember();
        variable = &anon->getAnonContainer();
    }
    TIntermSymbol* node = addSymbol(*variable);
    linkage = growAggregate(linkage, node);
}